

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sit.c
# Opt level: O3

int dosit(void)

{
  char cVar1;
  boolean bVar2;
  byte bVar3;
  uint uVar4;
  char *pcVar5;
  trap *ptVar6;
  obj *poVar7;
  int tmp;
  int iVar8;
  int iVar9;
  char *pcVar10;
  obj *obj;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  
  if (u.usteed != (monst *)0x0) {
    pcVar5 = mon_nam(u.usteed);
    pline("You are already sitting on %s.",pcVar5);
    return 0;
  }
  cVar1 = level->locations[u.ux][u.uy].typ;
  bVar2 = can_reach_floor();
  if (bVar2 == '\0') {
    if ((u.uprops[0x12].extrinsic == 0 && u.uprops[0x12].intrinsic == 0) &&
       ((youmonst.data)->mlet != '\x05')) {
      pcVar5 = "You are sitting on air.";
    }
    else {
      pcVar5 = "You tumble in place.";
    }
LAB_00244825:
    iVar8 = 0;
LAB_00244827:
    pline(pcVar5);
    return iVar8;
  }
  bVar2 = is_pool(level,(int)u.ux,(int)u.uy);
  if ((bVar2 != '\0') && ((u._1052_1_ & 2) == 0)) {
LAB_0024460b:
    pline("You sit in the water.");
    uVar4 = mt_random();
    if (uarm != (obj *)0x0 &&
        (uVar4 * -0x33333333 >> 1 | (uint)((uVar4 * -0x33333333 & 1) != 0) << 0x1f) < 0x1999999a) {
      rust_dmg(uarm,"armor",1,'\x01',&youmonst);
    }
    uVar4 = mt_random();
    if (uarmf != (obj *)0x0 &&
        (uVar4 * -0x33333333 >> 1 | (uint)((uVar4 * -0x33333333 & 1) != 0) << 0x1f) < 0x1999999a) {
      if (uarmf->otyp != 0x97) {
        rust_dmg(uarm,"armor",1,'\x01',&youmonst);
        return 1;
      }
      return 1;
    }
    return 1;
  }
  ptVar6 = t_at(level,(int)u.ux,(int)u.uy);
  if ((ptVar6 != (trap *)0x0) &&
     ((u.utrap == 0 &&
      (bVar3 = ptVar6->field_0x8 & 0x1f,
      (ptVar6->field_0x8 & 0x20) != 0 && 0xfb < (byte)(bVar3 - 0xf))))) {
    pcVar5 = "pit";
    if (bVar3 == 0xe) {
      pcVar5 = "trapdoor";
    }
    pcVar10 = "hole";
    if (bVar3 != 0xd) {
      pcVar10 = pcVar5;
    }
    pcVar5 = "You sit on the edge of the %s.";
    goto LAB_00244810;
  }
  poVar7 = level->objects[u.ux][u.uy];
  if (poVar7 != (obj *)0x0) {
    pcVar5 = xname(poVar7);
    pcVar5 = the(pcVar5);
    pline("You sit on %s.",pcVar5);
    iVar8 = 1;
    if ((ushort)(poVar7->otyp - 0xdaU) < 3) {
      return 1;
    }
    if ((*(ushort *)&objects[poVar7->otyp].field_0x11 & 0x1f0) == 0x60) {
      return 1;
    }
    pcVar5 = "It\'s not very comfortable...";
    goto LAB_00244827;
  }
  ptVar6 = t_at(level,(int)u.ux,(int)u.uy);
  if (ptVar6 == (trap *)0x0) {
    if ((u.utrap == 0) || (u.utraptype < 3)) {
      if (((u._1052_1_ & 2) != 0) ||
         (bVar2 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar2 != '\0')) {
        bVar2 = on_level(&u.uz,&dungeon_topology.d_water_level);
        if (bVar2 == '\0') {
          pcVar5 = "You sit down on the muddy bottom.";
        }
        else {
          pcVar5 = "There are no cushions floating nearby.";
        }
        goto LAB_002449d9;
      }
      bVar2 = is_pool(level,(int)u.ux,(int)u.uy);
      if (bVar2 != '\0') goto LAB_0024460b;
      switch(cVar1) {
      case '\x1a':
        pcVar5 = "You sit on the %s.";
        pcVar10 = "stairs";
        break;
      case '\x1b':
        pcVar5 = "You sit on the %s.";
        pcVar10 = "ladder";
        break;
      default:
        bVar2 = is_lava(level,(int)u.ux,(int)u.uy);
        if (bVar2 != '\0') {
          pline("You sit on the %s.");
          burn_away_slime();
          if (youmonst.data != mons + 0x157 && youmonst.data != mons + 0xa0) {
            pline("The lava burns you!");
            iVar8 = 10;
            iVar9 = -10;
            do {
              uVar4 = mt_random();
              iVar8 = iVar8 + uVar4 % 10;
              iVar9 = iVar9 + 1;
            } while (iVar9 != 0);
            fire_damageu(iVar8,(monst *)0x0,"sitting on lava",1,0x14,'\0','\x01');
            return 1;
          }
          pcVar5 = "The lava feels warm.";
LAB_002449d9:
          pline(pcVar5);
          return 1;
        }
        bVar2 = is_ice(level,(int)u.ux,(int)u.uy);
        if (bVar2 != '\0') {
          pline("You sit on the %s.","ice");
          if (u.uprops[2].intrinsic != 0 || u.uprops[2].extrinsic != 0) {
            if ((u.uprops[2].intrinsic >> 0x1a & 1) == 0) {
              return 1;
            }
            if ((u.uprops[2].intrinsic & 0xfbffffff) != 0 || u.uprops[2].extrinsic != 0) {
              return 1;
            }
          }
          if (((byte)youmonst.mintrinsics & 2) != 0) {
            return 1;
          }
          pcVar5 = "The ice feels cold.";
          goto LAB_002449d9;
        }
        if (cVar1 == '\x1d') {
          pline("You sit on the %s.","opulent throne");
          uVar4 = mt_random();
          if (3 < uVar4 % 6) {
            mt_random();
            mt_random();
            uVar4 = mt_random();
            iVar8 = (*(code *)(&DAT_002cf960 +
                              *(int *)(&DAT_002cf960 +
                                      (ulong)(uVar4 - (uVar4 / 0xd + (uVar4 / 0xd) * 0xc)) * 4)))();
            return iVar8;
          }
          if (((youmonst.data)->mflags2 & 0x1000) == 0) {
            pcVar5 = "You feel somehow out of place...";
          }
          else {
            pcVar5 = "You feel very comfortable here.";
          }
          pline(pcVar5);
          uVar4 = mt_random();
          if (uVar4 * -0x55555555 < 0x55555556) {
            if (level->locations[u.ux][u.uy].typ == '\x1d') {
              level->locations[u.ux][u.uy].typ = '\x19';
              pline("The throne vanishes in a puff of logic.");
              newsym((int)u.ux,(int)u.uy);
              return 1;
            }
            return 1;
          }
          return 1;
        }
        if (cVar1 == '$') {
          pcVar5 = "You sit on the %s.";
          pcVar10 = "drawbridge";
          break;
        }
        if (((youmonst.data)->mflags1 & 0x400000) == 0) {
          if ((u._1052_1_ & 1) != 0) {
            pcVar5 = "There are no seats in here!";
            goto LAB_002449d9;
          }
          pcVar10 = surface((int)u.ux,(int)u.uy);
          pcVar5 = "Having fun sitting on the %s?";
          break;
        }
        if (flags.female == '\0') {
          pcVar5 = "Males can\'t lay eggs!";
        }
        else {
          if ((int)(uint)objects[0x10f].oc_nutrition <= u.uhunger) {
            poVar7 = mksobj(level,0x10f,'\0','\0');
            poVar7->spe = '\x01';
            poVar7->quan = 1;
            uVar4 = weight(poVar7);
            poVar7->owt = uVar4;
            iVar8 = egg_type_from_parent(u.umonnum,'\0');
            poVar7->corpsenm = iVar8;
            poVar7->field_0x4a = poVar7->field_0x4a | 0x30;
            attach_egg_hatch_timeout(poVar7);
            pline("You lay an egg.");
            dropy(poVar7);
            stackobj((obj *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
            morehungry((uint)objects[0x10f].oc_nutrition);
            return 1;
          }
          pcVar5 = "You don\'t have enough energy to lay an egg.";
        }
        goto LAB_00244825;
      case '\x1f':
        pline("You sit on the %s.","sink");
        pcVar10 = "rump";
        if (((youmonst.data)->mflags1 >> 0x11 & 1) == 0) {
          pcVar10 = "underside";
        }
        pcVar5 = "Your %s gets wet.";
        break;
      case ' ':
        pcVar10 = "grave";
        pcVar5 = "You sit on the %s.";
        break;
      case '!':
        pline("You sit on the %s.","altar");
        altar_wrath((int)u.ux,(int)u.uy);
        return 1;
      }
LAB_00244810:
      pline(pcVar5,pcVar10);
      return 1;
    }
  }
  else if (u.utrap == 0) {
    pline("You sit down.");
    dotrap(ptVar6,0);
    return 1;
  }
  exercise(2,'\0');
  switch(u.utraptype) {
  case 0:
    pcVar5 = body_part(5);
    pline("You can\'t sit down with your %s in the bear trap.",pcVar5);
    goto LAB_002448ef;
  case 1:
    if ((ptVar6->field_0x8 & 0x1f) == 0xc) {
      pline("You sit down on a spike.  Ouch!");
      losehp(1,"sitting on an iron spike",1);
      exercise(0,'\0');
    }
    else {
      pline("You sit down in the pit.");
    }
    uVar4 = mt_random();
    u.utrap = u.utrap + uVar4 % 5;
    break;
  case 2:
    pline("You sit in the spider web and get entangled further!");
    uVar4 = mt_random();
    u.utrap = uVar4 % 10 + u.utrap + 5;
    break;
  case 3:
    pline("You sit in the lava!");
    uVar4 = mt_random();
    u.utrap = (uVar4 & 3) + u.utrap + 1;
    iVar8 = 2;
    iVar9 = -2;
    do {
      uVar4 = mt_random();
      iVar8 = iVar8 + uVar4 % 10;
      iVar9 = iVar9 + 1;
    } while (iVar9 != 0);
    losehp(iVar8,"sitting in lava",1);
    break;
  case 4:
    pline("You can\'t maneuver to sit!");
LAB_002448ef:
    u.utrap = u.utrap + 1;
  }
  return 1;
}

Assistant:

int dosit(void)
{
	static const char sit_message[] = "You sit on the %s.";
	struct trap *trap;
	int typ = level->locations[u.ux][u.uy].typ;


	if (u.usteed) {
	    pline("You are already sitting on %s.", mon_nam(u.usteed));
	    return 0;
	}

	if (!can_reach_floor())	{
	    if (Levitation)
		pline("You tumble in place.");
	    else
		pline("You are sitting on air.");
	    return 0;
	} else if (is_pool(level, u.ux, u.uy) && !Underwater) {  /* water walking */
	    goto in_water;
	}

	if ((trap = t_at(level, u.ux, u.uy)) != 0 && !u.utrap &&
	    (trap->ttyp == HOLE || trap->ttyp == TRAPDOOR ||
	     trap->ttyp == PIT || trap->ttyp == SPIKED_PIT) &&
	     trap->tseen) {
	    pline("You sit on the edge of the %s.",
		  trap->ttyp == HOLE ? "hole" :
		  trap->ttyp == TRAPDOOR ? "trapdoor" : "pit");
	    return 1;
	}

	if (OBJ_AT(u.ux, u.uy)) {
	    struct obj *obj;

	    obj = level->objects[u.ux][u.uy];
	    pline("You sit on %s.", the(xname(obj)));
	    if (!(Is_box(obj) || objects[obj->otyp].oc_material == CLOTH))
		pline("It's not very comfortable...");

	} else if ((trap = t_at(level, u.ux, u.uy)) != 0 ||
		   (u.utrap && (u.utraptype >= TT_LAVA))) {

	    if (u.utrap) {
		exercise(A_WIS, FALSE);	/* you're getting stuck longer */
		if (u.utraptype == TT_BEARTRAP) {
		    pline("You can't sit down with your %s in the bear trap.", body_part(FOOT));
		    u.utrap++;
	        } else if (u.utraptype == TT_PIT) {
		    if (trap->ttyp == SPIKED_PIT) {
			pline("You sit down on a spike.  Ouch!");
			losehp(1, "sitting on an iron spike", KILLED_BY);
			exercise(A_STR, FALSE);
		    } else
			pline("You sit down in the pit.");
		    u.utrap += rn2(5);
		} else if (u.utraptype == TT_WEB) {
		    pline("You sit in the spider web and get entangled further!");
		    u.utrap += rn1(10, 5);
		} else if (u.utraptype == TT_LAVA) {
		    /* Must have fire resistance or they'd be dead already */
		    pline("You sit in the lava!");
		    u.utrap += rnd(4);
		    losehp(dice(2,10), "sitting in lava", KILLED_BY);
		} else if (u.utraptype == TT_INFLOOR) {
		    pline("You can't maneuver to sit!");
		    u.utrap++;
		}
	    } else {
	        pline("You sit down.");
		dotrap(trap, 0);
	    }
	} else if (Underwater || Is_waterlevel(&u.uz)) {
	    if (Is_waterlevel(&u.uz))
		pline("There are no cushions floating nearby.");
	    else
		pline("You sit down on the muddy bottom.");
	} else if (is_pool(level, u.ux, u.uy)) {
 in_water:
	    pline("You sit in the water.");
	    if (!rn2(10) && uarm)
		rust_dmg(uarm, "armor", 1, TRUE, &youmonst);
	    if (!rn2(10) && uarmf && uarmf->otyp != WATER_WALKING_BOOTS)
		rust_dmg(uarm, "armor", 1, TRUE, &youmonst);
	} else if (IS_SINK(typ)) {

	    pline(sit_message, defexplain[S_sink]);
	    pline("Your %s gets wet.", humanoid(youmonst.data) ? "rump" : "underside");
	} else if (IS_ALTAR(typ)) {

	    pline(sit_message, defexplain[S_altar]);
	    altar_wrath(u.ux, u.uy);

	} else if (IS_GRAVE(typ)) {

	    pline(sit_message, defexplain[S_grave]);

	} else if (typ == STAIRS) {

	    pline(sit_message, "stairs");

	} else if (typ == LADDER) {

	    pline(sit_message, "ladder");

	} else if (is_lava(level, u.ux, u.uy)) {

	    /* must be WWalking */
	    pline(sit_message, "lava");
	    burn_away_slime();
	    if (likes_lava(youmonst.data)) {
		pline("The lava feels warm.");
		return 1;
	    }
	    pline("The lava burns you!");
	    fire_damageu(dice(10, 10), NULL, "sitting on lava", KILLED_BY,
			 20, FALSE, TRUE);

	} else if (is_ice(level, u.ux, u.uy)) {

	    pline(sit_message, defexplain[S_ice]);
	    if (!FCold_resistance) pline("The ice feels cold.");

	} else if (typ == DRAWBRIDGE_DOWN) {

	    pline(sit_message, "drawbridge");

	} else if (IS_THRONE(typ)) {

	    pline(sit_message, defexplain[S_throne]);
	    if (rnd(6) > 4)  {
		int which_attr = rn2(A_MAX);
		int attr_amount = -rn1(4,3);
		switch (rnd(13))  {
		    case 1:
			adjattrib(which_attr, attr_amount, FALSE, 0);
			losehp(rnd(10), "cursed throne", KILLED_BY_AN);
			break;
		    case 2:
			adjattrib(rn2(A_MAX), 1, FALSE, 0);
			break;
		    case 3:
			pline("A%s electric shock shoots through your body!",
			      (Shock_resistance) ? "n" : " massive");
			elec_damageu(rnd(30), NULL, "electric chair", KILLED_BY_AN,
				     0, FALSE);
			break;
		    case 4:
			pline("You feel much, much better!");
			if (Upolyd) {
			    if (u.mh >= (u.mhmax - 5))  u.mhmax += 4;
			    u.mh = u.mhmax;
			}
			if (u.uhp >= (u.uhpmax - 5))  u.uhpmax += 4;
			u.uhp = u.uhpmax;
			make_blinded(0L,TRUE);
			make_sick(0L, NULL, FALSE, SICK_ALL);
			heal_legs();
			iflags.botl = 1;
			break;
		    case 5:
			take_gold();
			break;
		    case 6:
			if (u.uluck + rn2(5) < 0) {
			    pline("You feel your luck is changing.");
			    change_luck(1);
			} else {
			    fix_attributes_and_properties(NULL, 6);
			}
			break;
		    case 7:
			{
			int cnt = rnd(10);

			pline("A voice echoes:");
			verbalize("Thy audience hath been summoned, %s!",
				  flags.female ? "Dame" : "Sire");
			while (cnt--)
			    makemon(courtmon(&u.uz), level, u.ux, u.uy, NO_MM_FLAGS);
			break;
			}
		    case 8:
			pline("A voice echoes:");
			verbalize("By thy Imperious order, %s...",
				  flags.female ? "Dame" : "Sire");
			do_genocide(5, FALSE);	/* REALLY|ONTHRONE, see do_genocide() */
			break;
		    case 9:
			pline("A voice echoes:");
	verbalize("A curse upon thee for sitting upon this most holy throne!");
			if (Luck > 0)  {
			    make_blinded(Blinded + rn1(100,250),TRUE);
			} else	    rndcurse();
			break;
		    case 10:
			if (Luck < 0 || (HSee_invisible & INTRINSIC))  {
				if (level->flags.nommap) {
					pline(
					"A terrible drone fills your head!");
					make_confused(HConfusion + rnd(30),
									FALSE);
				} else {
					pline("An image forms in your mind.");
					do_mapping();
				}
			} else  {
				pline("Your vision becomes clear.");
				HSee_invisible |= FROMOUTSIDE;
				newsym(u.ux, u.uy);
			}
			break;
		    case 11:
			if (Luck < 0)  {
			    pline("You feel threatened.");
			    aggravate();
			} else  {

			    pline("You feel a wrenching sensation.");
			    tele(NULL);		/* teleport him */
			}
			break;
		    case 12:
			pline("You are granted an insight!");
			if (invent) {
			    /* rn1(4, 3) agrees w/seffects() */
			    identify_pack(rn1(4, 3));
			}
			break;
		    case 13:
			pline("Your mind turns into a pretzel!");
			make_confused(HConfusion + rn1(7,16),FALSE);
			break;
		    default:	impossible("throne effect");
				break;
		}
	    } else {
		if (is_prince(youmonst.data))
		    pline("You feel very comfortable here.");
		else
		    pline("You feel somehow out of place...");
	    }

	    if (!rn2(3) && IS_THRONE(level->locations[u.ux][u.uy].typ)) {
		/* may have teleported */
		level->locations[u.ux][u.uy].typ = ROOM;
		pline("The throne vanishes in a puff of logic.");
		newsym(u.ux,u.uy);
	    }

	} else if (lays_eggs(youmonst.data)) {
		struct obj *uegg;

		if (!flags.female) {
			pline("Males can't lay eggs!");
			return 0;
		}

		if (u.uhunger < (int)objects[EGG].oc_nutrition) {
			pline("You don't have enough energy to lay an egg.");
			return 0;
		}

		uegg = mksobj(level, EGG, FALSE, FALSE);
		uegg->spe = 1;
		uegg->quan = 1;
		uegg->owt = weight(uegg);
		uegg->corpsenm = egg_type_from_parent(u.umonnum, FALSE);
		uegg->known = uegg->dknown = 1;
		attach_egg_hatch_timeout(uegg);
		pline("You lay an egg.");
		dropy(uegg);
		stackobj(uegg);
		morehungry((int)objects[EGG].oc_nutrition);
	} else if (u.uswallow)
		pline("There are no seats in here!");
	else
		pline("Having fun sitting on the %s?", surface(u.ux,u.uy));
	return 1;
}